

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.cpp
# Opt level: O1

bool __thiscall ser::Savepoint::operator<(Savepoint *this,Savepoint *other)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  byte extraout_var;
  
  __n = (this->name_)._M_string_length;
  if (__n == (other->name_)._M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((this->name_)._M_dataplus._M_p,(other->name_)._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_00160b2c;
    }
    bVar1 = MetainfoSet::operator<(&this->metainfo_,&other->metainfo_);
    return bVar1;
  }
LAB_00160b2c:
  std::__cxx11::string::compare((string *)this);
  return (bool)(extraout_var >> 7);
}

Assistant:

bool Savepoint::operator<(const Savepoint& other) const
{
    if (name_ != other.name_)
        return name_ < other.name_;

    return metainfo_ < other.metainfo_;
}